

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_listener::start(asio_rpc_listener *this,lock_guard<std::mutex> *listener_lock)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  undefined4 extraout_var;
  int __protocol;
  int __type;
  unsigned_long *in_RDI;
  ptr<rpc_session> session;
  session_closed_callback cb;
  ptr<asio_rpc_listener> self;
  _Placeholder<1> *in_stack_fffffffffffffea8;
  _Placeholder<1> *__args_3;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *in_stack_fffffffffffffeb0;
  shared_ptr<nuraft::rpc_session> *__args_2;
  _Bind<void_(nuraft::asio_rpc_listener::*(std::shared_ptr<nuraft::asio_rpc_listener>,_std::_Placeholder<1>))(const_std::shared_ptr<nuraft::rpc_session>_&)>
  *in_stack_fffffffffffffeb8;
  shared_ptr<nuraft::asio_rpc_listener> *__args_1;
  function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *in_stack_fffffffffffffec0;
  _Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
  *token;
  bool *in_stack_fffffffffffffec8;
  context *args_3;
  asio_service_impl **args_1;
  shared_ptr<nuraft::raft_server> *in_stack_ffffffffffffff00;
  shared_ptr<nuraft::logger> *in_stack_ffffffffffffff08;
  function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *in_stack_ffffffffffffff10;
  native_handle_type local_c0 [5];
  code *local_98;
  undefined8 local_90;
  shared_ptr<nuraft::asio_rpc_listener> local_68 [2];
  asio_service_impl *local_48 [4];
  native_handle_type local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  context *local_8;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer;
  
  bVar1 = asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::is_open
                    (in_stack_fffffffffffffeb0);
  if (bVar1) {
    args_1 = local_48;
    std::enable_shared_from_this<nuraft::asio_rpc_listener>::shared_from_this
              ((enable_shared_from_this<nuraft::asio_rpc_listener> *)in_stack_fffffffffffffea8);
    local_98 = remove_session;
    local_90 = 0;
    std::
    bind<void(nuraft::asio_rpc_listener::*)(std::shared_ptr<nuraft::rpc_session>const&),std::shared_ptr<nuraft::asio_rpc_listener>&,std::_Placeholder<1>const&>
              (&in_stack_fffffffffffffeb8->_M_f,
               (shared_ptr<nuraft::asio_rpc_listener> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    std::function<void(std::shared_ptr<nuraft::rpc_session>const&)>::
    function<std::_Bind<void(nuraft::asio_rpc_listener::*(std::shared_ptr<nuraft::asio_rpc_listener>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>const&)>,void>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::
    _Bind<void_(nuraft::asio_rpc_listener::*(std::shared_ptr<nuraft::asio_rpc_listener>,_std::_Placeholder<1>))(const_std::shared_ptr<nuraft::rpc_session>_&)>
    ::~_Bind((_Bind<void_(nuraft::asio_rpc_listener::*(std::shared_ptr<nuraft::asio_rpc_listener>,_std::_Placeholder<1>))(const_std::shared_ptr<nuraft::rpc_session>_&)>
              *)0x1dae43);
    args_3 = (context *)(in_RDI + 0x1c);
    local_10 = 1;
    local_14 = 5;
    local_20 = 1;
    LOCK();
    local_c0[0] = args_3->handle_;
    args_3->handle_ = args_3->handle_ + 1;
    UNLOCK();
    __protocol = (int)in_RDI[4];
    __args_3 = (_Placeholder<1> *)(in_RDI + 0xb);
    __args_2 = (shared_ptr<nuraft::rpc_session> *)(in_RDI + 0x23);
    __args_1 = local_68;
    iVar2 = (int)local_c0;
    local_28 = local_c0[0];
    local_8 = args_3;
    cs_new<nuraft::rpc_session,unsigned_long,nuraft::asio_service_impl*&,asio::io_context&,asio::ssl::context&,bool&,std::shared_ptr<nuraft::raft_server>&,std::shared_ptr<nuraft::logger>&,std::function<void(std::shared_ptr<nuraft::rpc_session>const&)>&>
              (in_RDI,args_1,(io_context *)0x4,args_3,in_stack_fffffffffffffec8,
               in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    token = (_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
             *)(in_RDI + 0xe);
    this_00 = std::
              __shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1dafc2);
    iVar2 = rpc_session::socket(this_00,iVar2,__type,__protocol);
    peer = (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)CONCAT44(extraout_var,iVar2);
    std::
    bind<void(nuraft::asio_rpc_listener::*)(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&),nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>&,std::shared_ptr<nuraft::rpc_session>&,std::_Placeholder<1>const&>
              ((offset_in_asio_rpc_listener_to_subr *)peer,(asio_rpc_listener **)token,__args_1,
               __args_2,__args_3);
    asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
    async_accept<asio::ip::tcp,asio::any_io_executor,std::_Bind<void(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener*,std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>
              ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)args_3,peer,token,
               (type)((ulong)__args_1 >> 0x20));
    std::
    _Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
    ::~_Bind((_Bind<void_(nuraft::asio_rpc_listener::*(nuraft::asio_rpc_listener_*,_std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_listener>,_std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
              *)0x1db03f);
    std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x1db04c);
    std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::~function
              ((function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *)0x1db059);
    std::shared_ptr<nuraft::asio_rpc_listener>::~shared_ptr
              ((shared_ptr<nuraft::asio_rpc_listener> *)0x1db066);
  }
  return;
}

Assistant:

void start(std::lock_guard<std::mutex> & listener_lock) {
        if (!acceptor_.is_open()) {
            return;
        }

        ptr<asio_rpc_listener> self(this->shared_from_this());
        session_closed_callback cb =
            std::bind( &asio_rpc_listener::remove_session,
                       self,
                       std::placeholders::_1 );

        ptr<rpc_session> session =
            cs_new< rpc_session >
            ( session_id_cnt_.fetch_add(1),
              impl_, io_svc_, ssl_ctx_, ssl_enabled_,
              handler_, l_, cb );

        acceptor_.async_accept( session->socket(),
                                std::bind( &asio_rpc_listener::handle_accept,
                                           this,
                                           self,
                                           session,
                                           std::placeholders::_1 ) );
    }